

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O3

int fp_unpack(char *infits,char *outfits)

{
  fitsfile *pfVar1;
  fitsfile *pfVar2;
  char *pcVar3;
  size_t sVar4;
  ushort **ppuVar5;
  long lVar6;
  int stat_00;
  char *unaff_RBP;
  undefined8 *puVar7;
  undefined8 *puVar8;
  bool bVar9;
  byte bVar10;
  undefined8 in_stack_00000078;
  char in_stack_00000295;
  int stat;
  fitsfile *infptr;
  int hdutype;
  fitsfile *outfptr;
  char *loc;
  char hduname [513];
  undefined8 auStack_908 [213];
  int local_25c;
  fitsfile *local_258;
  int local_24c;
  fitsfile *local_248;
  char *local_240;
  char local_238 [520];
  
  bVar10 = 0;
  local_25c = 0;
  bVar9 = false;
  ffopentest(10,&local_258,infits,0,&local_25c);
  ffinit(&local_248,outfits,&local_25c);
  stat_00 = local_25c;
  if (local_25c == 0) {
    if (in_stack_00000295 != '\0') {
      pcVar3 = strchr(&stack0x00000295,0x2c);
      bVar9 = pcVar3 == (char *)0x0;
      local_240 = pcVar3;
      if (bVar9) {
        strcpy(local_238,&stack0x00000295);
        sVar4 = strlen(local_238);
        unaff_RBP = &stack0x00000295 + sVar4;
      }
      else {
        *pcVar3 = '\0';
        strcpy(local_238,&stack0x00000295);
        unaff_RBP = pcVar3 + 1;
      }
      ppuVar5 = __ctype_b_loc();
      if (((*(byte *)((long)*ppuVar5 + (long)local_238[0] * 2 + 1) & 8) == 0) ||
         (lVar6 = strtol(local_238,&local_240,10), *local_240 != '\0')) {
        local_24c = 0;
        ffmnhd(local_258,0,local_238,0,&local_25c);
      }
      else {
        ffmahd(local_258,(int)lVar6 + 1,&local_24c,&local_25c);
        if (local_24c != 0) {
          local_25c = 0xe9;
          goto LAB_001098ee;
        }
      }
    }
    if (local_25c != 0) {
LAB_001098ee:
      printf("%s","Unable to find and move to extension \'");
      printf("%s",local_238);
      puts("\'");
      fp_abort_output(local_258,local_248,local_25c);
    }
    stat_00 = 0;
LAB_00109665:
    pfVar2 = local_248;
    pfVar1 = local_258;
    if (stat_00 == 0) {
      if (bVar9) {
        local_25c = -1;
      }
      puVar7 = (undefined8 *)&stack0x00000008;
      puVar8 = auStack_908;
      for (lVar6 = 0xd5; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
      }
      fp_unpack_hdu(pfVar1,pfVar2,&local_25c);
      if (in_stack_00000078._4_4_ != 0) {
        ffpcks(local_248,&local_25c);
      }
      if (in_stack_00000295 == '\0') {
        ffmrhd(local_258,1,(int *)0x0,&local_25c);
        stat_00 = local_25c;
      }
      else {
        if (*unaff_RBP != '\0') {
          pcVar3 = strchr(unaff_RBP,0x2c);
          local_240 = pcVar3;
          if (pcVar3 == (char *)0x0) {
            strcpy(local_238,unaff_RBP);
            *unaff_RBP = '\0';
          }
          else {
            *pcVar3 = '\0';
            strcpy(local_238,unaff_RBP);
            unaff_RBP = pcVar3 + 1;
          }
          ppuVar5 = __ctype_b_loc();
          if (((*(byte *)((long)*ppuVar5 + (long)local_238[0] * 2 + 1) & 8) == 0) ||
             (lVar6 = strtol(local_238,&local_240,10), *local_240 != '\0')) {
            local_24c = 0;
            ffmnhd(local_258,0,local_238,0,&local_25c);
LAB_001097a9:
            stat_00 = local_25c;
            if (local_25c == 0) goto LAB_00109665;
          }
          else {
            ffmahd(local_258,(int)lVar6 + 1,&local_24c,&local_25c);
            if (local_24c == 0) goto LAB_001097a9;
            local_25c = 0xe9;
          }
          printf("%s","Unable to find and move to extension \'");
          printf("%s",local_238);
          puts("\'");
          stat_00 = local_25c;
          goto LAB_00109665;
        }
        local_25c = 0x6b;
        stat_00 = local_25c;
      }
      goto LAB_00109665;
    }
    if (stat_00 == 0x6b) {
      local_25c = 0;
      stat_00 = 0;
    }
    if (in_stack_00000078._4_4_ != 0) {
      ffmahd(local_248,1,(int *)0x0,&local_25c);
      ffpcks(local_248,&local_25c);
      stat_00 = local_25c;
    }
    if (stat_00 == 0) {
      ffclos(local_248,&local_25c);
      ffclos(local_258,&local_25c);
      return 0;
    }
  }
  fp_abort_output(local_258,local_248,stat_00);
}

Assistant:

int fp_unpack (char *infits, char *outfits, fpstate fpvar)
{
        fitsfile *infptr, *outfptr;
        int stat=0, hdutype, extnum, single = 0;
	char *loc, *hduloc, hduname[SZ_STR];

        fits_open_file (&infptr, infits, READONLY, &stat);
        fits_create_file (&outfptr, outfits, &stat);

	if (stat) { 
	    fp_abort_output(infptr, outfptr, stat);
	}

        if (fpvar.extname[0]) {  /* unpack a list of HDUs? */

            /* move to the first HDU in the list */
	    hduloc = fpvar.extname;
	    loc = strchr(hduloc, ','); /* look for 'comma' delimiter between names */
	    
	    if (loc)         
	        *loc = '\0';  /* terminate the first name in the string */

	    strcpy(hduname, hduloc);  /* copy the first name into temporary string */

	    if (loc)        
	        hduloc = loc + 1;  /* advance to the beginning of the next name, if any */
            else {
	        hduloc += strlen(hduname);  /* end of the list */
	        single = 1;  /* only 1 HDU is being unpacked */
            }

            if (isdigit( (int) hduname[0]) ) {
	       extnum = strtol(hduname, &loc, 10); /* read the string as an integer */

               /* check for junk following the integer */
               if (*loc == '\0' )  /* no junk, so move to this HDU number (+1) */
               {	       
                  fits_movabs_hdu(infptr, extnum + 1, &hdutype, &stat);  /* move to HDU number */
                  if (hdutype != IMAGE_HDU)
		     stat = NOT_IMAGE;

               } else {  /* the string is not an integer, so must be the column name */
	          hdutype = IMAGE_HDU;
	          fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
 	       }
            }
	    else
	    {
                /* move to the named image extension */
  	        hdutype = IMAGE_HDU;
	        fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
            }
        }

        if (stat) {
	  fp_msg ("Unable to find and move to extension '");
          fp_msg(hduname);
	  fp_msg("'\n");
	  fp_abort_output(infptr, outfptr, stat);
        }

        while (! stat) {
	
	    if (single)
	        stat = -1;  /* special status flag to force output primary array */

            fp_unpack_hdu (infptr, outfptr, fpvar, &stat);

	    if (fpvar.do_checksums) {
	        fits_write_chksum (outfptr, &stat);
	    }

	    /* move to the next HDU */
            if (fpvar.extname[0]) {  /* unpack a list of HDUs? */

                if (!(*hduloc)) {
		    stat = END_OF_FILE;  /* we reached the end of the list */
		} else {
		    /* parse the next HDU name and move to it */
	            loc = strchr(hduloc, ',');
	    
	            if (loc)         /* look for 'comma' delimiter between names */
	               *loc = '\0';  /* terminate the first name in the string */

	            strcpy(hduname, hduloc);  /* copy the next name into temporary string */

	            if (loc)         
	                hduloc = loc + 1;  /* advance to the beginning of the next name, if any */
                    else
	               *hduloc = '\0';  /* end of the list */

                    if (isdigit( (int) hduname[0]) ) {
	               extnum = strtol(hduname, &loc, 10); /* read the string as an integer */

                      /* check for junk following the integer */
                      if (*loc == '\0' )   /* no junk, so move to this HDU number (+1) */
		      {	       
                        fits_movabs_hdu(infptr, extnum + 1, &hdutype, &stat);  /* move to HDU number */
                        if (hdutype != IMAGE_HDU)
		        stat = NOT_IMAGE;

                      } else {  /* the string is not an integer, so must be the column name */
	                hdutype = IMAGE_HDU;
	                fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
 	              }

                    } else {
                      /* move to the named image extension */
  	              hdutype = IMAGE_HDU;
	              fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
                   }

                   if (stat) {
	              fp_msg ("Unable to find and move to extension '");
                      fp_msg(hduname);
	              fp_msg("'\n");
                   }
                }
            } else {
                /* increment to the next HDU */
                fits_movrel_hdu (infptr, 1, NULL, &stat);
            }
        }

        if (stat == END_OF_FILE) stat = 0;

        /* set checksum for case of newly created primary HDU
         */
	if (fpvar.do_checksums) {
	    fits_movabs_hdu (outfptr, 1, NULL, &stat);
	    fits_write_chksum (outfptr, &stat);
	}


	if (stat) { 
	    fp_abort_output(infptr, outfptr, stat);
	}

	fits_close_file (outfptr, &stat);
	fits_close_file (infptr, &stat);

	return(0);
}